

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::EGLThread::~EGLThread(EGLThread *this)

{
  EGLThread *this_local;
  
  ~EGLThread(this);
  operator_delete(this,200);
  return;
}

Assistant:

EGLThread::~EGLThread (void)
{
	EGLThread::deinit();
}